

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O2

void __thiscall CArmInstruction::FormatOpcode(CArmInstruction *this,char *Dest,char *Source)

{
  char cVar1;
  char cVar2;
  uchar *puVar3;
  char *pcVar4;
  char (*__src) [3];
  
  do {
    cVar2 = *Source;
    if (cVar2 == 'A') {
      puVar3 = "\x03\x01\x02";
      if (((uint)(this->Opcode).flags >> 0xb & 1) == 0) {
        puVar3 = "\x03\x01\x02";
      }
      __src = ArmAddressingModes + puVar3[(this->Vars).Opcode.a];
LAB_00155d8c:
      pcVar4 = stpcpy(Dest,*__src);
      Dest = Dest + ((int)pcVar4 - (int)Dest);
    }
    else {
      if (cVar2 == 'C') {
        __src = ArmConditions + (this->Vars).Opcode.c;
        goto LAB_00155d8c;
      }
      if (cVar2 == 'S') {
        if ((this->Vars).Opcode.s == true) {
          *Dest = 's';
          goto LAB_00155d7b;
        }
      }
      else {
        if (cVar2 == 'X') {
          cVar1 = (this->Vars).Opcode.x;
LAB_00155d73:
          cVar2 = 'b';
          if (cVar1 != '\0') {
            cVar2 = 't';
          }
        }
        else {
          if (cVar2 == 'Y') {
            cVar1 = (this->Vars).Opcode.y;
            goto LAB_00155d73;
          }
          if (cVar2 == '\0') {
            *Dest = '\0';
            return;
          }
        }
        *Dest = cVar2;
LAB_00155d7b:
        Dest = Dest + 1;
      }
    }
    Source = Source + 1;
  } while( true );
}

Assistant:

void CArmInstruction::FormatOpcode(char* Dest, const char* Source) const
{
	while (*Source != 0)
	{
		switch (*Source)
		{
		case 'C':	// condition
			Dest += sprintf(Dest,"%s",ArmConditions[Vars.Opcode.c]);
			Source++;
			break;
		case 'S':	// set flag
			if (Vars.Opcode.s) *Dest++ = 's';
			Source++;
			break;
		case 'A':	// addressing mode
			if (Opcode.flags & ARM_LOAD)
			{
				Dest += sprintf(Dest,"%s",ArmAddressingModes[LdmModes[Vars.Opcode.a]]);
			} else {
				Dest += sprintf(Dest,"%s",ArmAddressingModes[StmModes[Vars.Opcode.a]]);
			}
			Source++;
			break;
		case 'X':	// x flag
			if (!Vars.Opcode.x) *Dest++ = 'b';
			else *Dest++ = 't';
			Source++;
			break;
		case 'Y':	// y flag
			if (!Vars.Opcode.y) *Dest++ = 'b';
			else *Dest++ = 't';
			Source++;
			break;
		default:
			*Dest++ = *Source++;
			break;
		}
	}
	*Dest = 0;
}